

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O0

void __thiscall Belief::Set(Belief *this,vector<double,_std::allocator<double>_> *belief)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  StateDistributionVector *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  pointer *o;
  StateDistributionVector *__new_size;
  
  o = &(in_RDI->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  __new_size = in_RDI;
  std::vector<double,_std::allocator<double>_>::size(in_RSI);
  std::vector<double,_std::allocator<double>_>::resize(unaff_retaddr,(size_type)__new_size);
  StateDistributionVector::operator=(in_RDI,(SDV *)o);
  return;
}

Assistant:

void Belief::Set(const vector<double> &belief)
{
    _m_b.resize(belief.size());
    _m_b=belief;
#if Belief_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
}